

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

inform_dist * inform_dist_infer(int *events,size_t n)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  inform_dist *dist;
  int iVar3;
  
  if (n != 0 && events != (int *)0x0) {
    iVar3 = -1;
    for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
      iVar1 = events[sVar2];
      if (iVar1 < 0) {
        return (inform_dist *)0x0;
      }
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
    }
    if ((-1 < iVar3) && (dist = inform_dist_alloc((ulong)(iVar3 + 1)), dist != (inform_dist *)0x0))
    {
      sVar2 = inform_dist_accumulate(dist,events,n);
      if (sVar2 == n) {
        return dist;
      }
      inform_dist_free(dist);
    }
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_infer(int const *events, size_t n)
{
    // if no events are observed, return NULL
    if (events == NULL || n == 0) return NULL;

    // infer the support
    int b = -1, event = 0;
    for (size_t i = 0; i < n; ++i)
    {
        event = events[i];
        if (event < 0)
        {
            b = -2;
            break;
        }
        if (event > b) b = event;
    }
    if (b < 0) return NULL;
    // the base is one greater than the largest observed event
    b += 1;
    // allocate the distribution
    inform_dist *dist = inform_dist_alloc(b);
    // accumulate the observations
    if (dist != NULL)
    {
        if (inform_dist_accumulate(dist, events, n) != n)
        {
            inform_dist_free(dist);
            dist = NULL;
        }
    }
    return dist;
}